

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Extractor::extract(Extractor *this,int blob_index,Mat *feat,int type)

{
  int iVar1;
  ExtractorPrivate *pEVar2;
  NetPrivate *this_00;
  int *piVar3;
  int iVar4;
  int iVar5;
  int flush_denormals;
  int iVar6;
  Mat *pMVar7;
  void *in_R8;
  bool bVar8;
  Mat bottom_blob_unpacked;
  Mat local_88;
  int local_34;
  
  if (blob_index < 0) {
    return -1;
  }
  if ((int)((ulong)((long)(this->d->blob_mats).
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->d->blob_mats).
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) * 0x38e38e39 <= blob_index) {
    return -1;
  }
  local_34 = get_kmp_blocktime();
  set_kmp_blocktime((this->d->opt).openmp_blocktime);
  flush_denormals = get_flush_denormals();
  set_flush_denormals((this->d->opt).flush_denormals);
  pEVar2 = this->d;
  iVar6 = 0;
  if ((pEVar2->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[(uint)blob_index].dims == 0) {
    this_00 = pEVar2->net->d;
    iVar6 = (this_00->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
            super__Vector_impl_data._M_start[(uint)blob_index].producer;
    if ((pEVar2->opt).use_local_pool_allocator == true) {
      if ((pEVar2->opt).blob_allocator == (Allocator *)0x0) {
        (pEVar2->opt).blob_allocator = &this_00->local_blob_allocator->super_Allocator;
      }
      if ((pEVar2->opt).workspace_allocator == (Allocator *)0x0) {
        (pEVar2->opt).workspace_allocator = &this_00->local_workspace_allocator->super_Allocator;
      }
    }
    iVar6 = NetPrivate::forward_layer(this_00,iVar6,&pEVar2->blob_mats,&pEVar2->opt);
  }
  pMVar7 = (this->d->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start + (uint)blob_index;
  if (pMVar7 != feat) {
    piVar3 = pMVar7->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = feat->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (feat->allocator == (Allocator *)0x0) {
          if (feat->data != (void *)0x0) {
            free(feat->data);
          }
        }
        else {
          (*feat->allocator->_vptr_Allocator[3])();
        }
      }
    }
    feat->cstep = 0;
    feat->data = (void *)0x0;
    feat->refcount = (int *)0x0;
    *(undefined8 *)((long)&feat->refcount + 4) = 0;
    *(undefined8 *)((long)&feat->elemsize + 4) = 0;
    feat->dims = 0;
    feat->w = 0;
    feat->h = 0;
    feat->d = 0;
    feat->c = 0;
    piVar3 = pMVar7->refcount;
    feat->data = pMVar7->data;
    feat->refcount = piVar3;
    feat->elemsize = pMVar7->elemsize;
    feat->elempack = pMVar7->elempack;
    feat->allocator = pMVar7->allocator;
    iVar1 = pMVar7->w;
    iVar4 = pMVar7->h;
    iVar5 = pMVar7->d;
    feat->dims = pMVar7->dims;
    feat->w = iVar1;
    feat->h = iVar4;
    feat->d = iVar5;
    feat->c = pMVar7->c;
    feat->cstep = pMVar7->cstep;
  }
  if (((type == 0) && ((this->d->opt).use_packing_layout != false)) && (feat->elempack != 1)) {
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.allocator = (Allocator *)0x0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
    convert_packing(feat,&local_88,1,&this->d->opt);
    if (&local_88 != feat) {
      piVar3 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = feat->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (feat->allocator == (Allocator *)0x0) {
            if (feat->data != (void *)0x0) {
              free(feat->data);
            }
          }
          else {
            (*feat->allocator->_vptr_Allocator[3])();
          }
        }
      }
      feat->cstep = 0;
      feat->data = (void *)0x0;
      feat->refcount = (int *)0x0;
      *(undefined8 *)((long)&feat->refcount + 4) = 0;
      *(undefined8 *)((long)&feat->elemsize + 4) = 0;
      feat->dims = 0;
      feat->w = 0;
      feat->h = 0;
      feat->d = 0;
      feat->c = 0;
      feat->data = local_88.data;
      feat->refcount = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      feat->elemsize = CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
      feat->elempack = local_88.elempack;
      feat->allocator = local_88.allocator;
      feat->dims = local_88.dims;
      feat->w = local_88.w;
      feat->h = local_88.h;
      feat->d = local_88.d;
      feat->c = local_88.c;
      feat->cstep = local_88.cstep;
    }
    piVar3 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if (local_88.data != (void *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  pEVar2 = this->d;
  iVar1 = feat->elempack;
  if ((type == 0) && ((pEVar2->opt).use_bf16_storage != false)) {
    if ((iVar1 == 0) || (((int)feat->elemsize << 3) / iVar1 != 0x10)) goto LAB_0014b211;
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.allocator = (Allocator *)0x0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
    cast_bfloat16_to_float32(feat,&local_88,&pEVar2->opt);
    if (&local_88 != feat) {
      piVar3 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = feat->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (feat->allocator == (Allocator *)0x0) {
            if (feat->data != (void *)0x0) {
              free(feat->data);
            }
          }
          else {
            (*feat->allocator->_vptr_Allocator[3])();
          }
        }
      }
      feat->cstep = 0;
      feat->data = (void *)0x0;
      feat->refcount = (int *)0x0;
      *(undefined8 *)((long)&feat->refcount + 4) = 0;
      *(undefined8 *)((long)&feat->elemsize + 4) = 0;
      feat->dims = 0;
      feat->w = 0;
      feat->h = 0;
      feat->d = 0;
      feat->c = 0;
      feat->data = local_88.data;
      feat->refcount = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      feat->elemsize = CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
      feat->elempack = local_88.elempack;
      feat->allocator = local_88.allocator;
      feat->dims = local_88.dims;
      feat->w = local_88.w;
      feat->h = local_88.h;
      feat->d = local_88.d;
      feat->c = local_88.c;
      feat->cstep = local_88.cstep;
    }
    piVar3 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar3 == (int *)0x0) goto LAB_0014b211;
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) goto LAB_0014b211;
    if (local_88.allocator != (Allocator *)0x0) {
      (*(local_88.allocator)->_vptr_Allocator[3])();
      goto LAB_0014b211;
    }
  }
  else {
    if (iVar1 == 0) {
      bVar8 = false;
    }
    else {
      bVar8 = ((int)feat->elemsize << 3) / iVar1 == 8;
    }
    if ((type != 0) || (!bVar8)) goto LAB_0014b211;
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.allocator = (Allocator *)0x0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
    cast_int8_to_float32(feat,&local_88,&pEVar2->opt);
    if (&local_88 != feat) {
      piVar3 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = feat->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (feat->allocator == (Allocator *)0x0) {
            if (feat->data != (void *)0x0) {
              free(feat->data);
            }
          }
          else {
            (*feat->allocator->_vptr_Allocator[3])();
          }
        }
      }
      feat->cstep = 0;
      feat->data = (void *)0x0;
      feat->refcount = (int *)0x0;
      *(undefined8 *)((long)&feat->refcount + 4) = 0;
      *(undefined8 *)((long)&feat->elemsize + 4) = 0;
      feat->dims = 0;
      feat->w = 0;
      feat->h = 0;
      feat->d = 0;
      feat->c = 0;
      feat->data = local_88.data;
      feat->refcount = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      feat->elemsize = CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
      feat->elempack = local_88.elempack;
      feat->allocator = local_88.allocator;
      feat->dims = local_88.dims;
      feat->w = local_88.w;
      feat->h = local_88.h;
      feat->d = local_88.d;
      feat->c = local_88.c;
      feat->cstep = local_88.cstep;
    }
    piVar3 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar3 == (int *)0x0) goto LAB_0014b211;
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) goto LAB_0014b211;
    if (local_88.allocator != (Allocator *)0x0) {
      (*(local_88.allocator)->_vptr_Allocator[3])();
      goto LAB_0014b211;
    }
  }
  if (local_88.data != (void *)0x0) {
    free(local_88.data);
  }
LAB_0014b211:
  if (((this->d->opt).use_local_pool_allocator == true) &&
     ((PoolAllocator *)feat->allocator == this->d->net->d->local_blob_allocator)) {
    Mat::clone(&local_88,(__fn *)feat,(void *)0x0,(int)(PoolAllocator *)feat->allocator,in_R8);
    if (&local_88 != feat) {
      piVar3 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = feat->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (feat->allocator == (Allocator *)0x0) {
            if (feat->data != (void *)0x0) {
              free(feat->data);
            }
          }
          else {
            (*feat->allocator->_vptr_Allocator[3])();
          }
        }
      }
      feat->cstep = 0;
      feat->data = (void *)0x0;
      feat->refcount = (int *)0x0;
      *(undefined8 *)((long)&feat->refcount + 4) = 0;
      *(undefined8 *)((long)&feat->elemsize + 4) = 0;
      feat->dims = 0;
      feat->w = 0;
      feat->h = 0;
      feat->d = 0;
      feat->c = 0;
      feat->data = local_88.data;
      feat->refcount = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      feat->elemsize = CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
      feat->elempack = local_88.elempack;
      feat->allocator = local_88.allocator;
      feat->dims = local_88.dims;
      feat->w = local_88.w;
      feat->h = local_88.h;
      feat->d = local_88.d;
      feat->c = local_88.c;
      feat->cstep = local_88.cstep;
    }
    piVar3 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if (local_88.data != (void *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  set_kmp_blocktime(local_34);
  set_flush_denormals(flush_denormals);
  return iVar6;
}

Assistant:

int Extractor::extract(int blob_index, Mat& feat, int type)
{
    if (blob_index < 0 || blob_index >= (int)d->blob_mats.size())
        return -1;

    int old_blocktime = get_kmp_blocktime();
    set_kmp_blocktime(d->opt.openmp_blocktime);

    int old_flush_denormals = get_flush_denormals();
    set_flush_denormals(d->opt.flush_denormals);

    int ret = 0;

    if (d->blob_mats[blob_index].dims == 0)
    {
        int layer_index = d->net->blobs()[blob_index].producer;

        // use local allocator
        if (d->opt.use_local_pool_allocator)
        {
            if (!d->opt.blob_allocator)
            {
                d->opt.blob_allocator = d->net->d->local_blob_allocator;
            }
            if (!d->opt.workspace_allocator)
            {
                d->opt.workspace_allocator = d->net->d->local_workspace_allocator;
            }
        }

#if NCNN_VULKAN
        if (d->opt.use_vulkan_compute)
        {
            // use local allocator
            if (!d->opt.blob_vkallocator)
            {
                d->local_blob_vkallocator = d->net->vulkan_device()->acquire_blob_allocator();
                d->opt.blob_vkallocator = d->local_blob_vkallocator;
            }
            if (!d->opt.workspace_vkallocator)
            {
                d->opt.workspace_vkallocator = d->opt.blob_vkallocator;
            }
            if (!d->opt.staging_vkallocator)
            {
                d->local_staging_vkallocator = d->net->vulkan_device()->acquire_staging_allocator();
                d->opt.staging_vkallocator = d->local_staging_vkallocator;
            }

            ncnn::VkCompute cmd(d->net->vulkan_device());
#if NCNN_BENCHMARK
            cmd.create_query_pool(d->net->layers().size() * 2);
#endif // NCNN_BENCHMARK

            // TODO vkimagemat for adreno
            if (d->opt.use_image_storage)
            {
                VkImageMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
            else
            {
                VkMat feat_gpu;
                ret = extract(blob_index, feat_gpu, cmd);

                if (d->blob_mats[blob_index].dims == 0 && feat_gpu.dims != 0)
                {
                    cmd.record_download(feat_gpu, d->blob_mats[blob_index], d->opt);

                    cmd.submit_and_wait();

#if NCNN_BENCHMARK
                    std::vector<uint64_t> results(d->net->layers().size() * 2);
                    cmd.get_query_pool_results(0, d->net->layers().size() * 2, results);
                    for (size_t i = 0; i < d->net->layers().size(); i++)
                    {
                        uint64_t start = results[i * 2];
                        uint64_t end = results[i * 2 + 1];
                        if (start == 0 || end == 0)
                            continue;

                        double duration_us = (end - start) * d->net->vulkan_device()->info.timestamp_period() / 1000;
                        NCNN_LOGE("%-24s %-30s %8.2lfus    |", d->net->layers()[i]->type.c_str(), d->net->layers()[i]->name.c_str(), duration_us);
                    }
#endif // NCNN_BENCHMARK
                }
            }
        }
        else
        {
            ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
        }
#else
        ret = d->net->d->forward_layer(layer_index, d->blob_mats, d->opt);
#endif // NCNN_VULKAN
    }

    feat = d->blob_mats[blob_index];

    if (d->opt.use_packing_layout && (type == 0) && feat.elempack != 1)
    {
        Mat bottom_blob_unpacked;
        convert_packing(feat, bottom_blob_unpacked, 1, d->opt);
        feat = bottom_blob_unpacked;
    }

    // clang-format off
    // *INDENT-OFF*
#if NCNN_ARM82
    if (d->opt.use_fp16_storage && cpu_support_arm_asimdhp() && (type == 0))
    {
        if (feat.elembits() == 16)
        {
            Mat feat_fp32;
            cast_float16_to_float32(feat, feat_fp32, d->opt);
            feat = feat_fp32;
        }
    }
    else
#endif // NCNN_ARM82
#if NCNN_BF16
    if (d->opt.use_bf16_storage && (type == 0))
    {
        if (feat.elembits() == 16)
        {
            Mat feat_fp32;
            cast_bfloat16_to_float32(feat, feat_fp32, d->opt);
            feat = feat_fp32;
        }
    }
    else
#endif // NCNN_BF16
    if (feat.elembits() == 8 && (type == 0))
    {
        Mat feat_fp32;
        cast_int8_to_float32(feat, feat_fp32, d->opt);
        feat = feat_fp32;
    }
    // *INDENT-ON*
    // clang-format on

    if (d->opt.use_local_pool_allocator && feat.allocator == d->net->d->local_blob_allocator)
    {
        // detach the returned mat from local pool allocator
        // so we could destroy net instance much earlier
        feat = feat.clone();
    }

    set_kmp_blocktime(old_blocktime);
    set_flush_denormals(old_flush_denormals);

    return ret;
}